

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O3

void __thiscall
Diligent::GLContextState::SetBlendState
          (GLContextState *this,BlendStateDesc *BSDsc,Uint32 RenderTargetMask,Uint32 SampleMask)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  COLOR_MASK CVar3;
  BLEND_FACTOR BVar4;
  BLEND_OPERATION BVar5;
  undefined4 uVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLenum GVar9;
  uint uVar10;
  COLOR_MASK CVar11;
  char *pcVar12;
  BlendStateDesc *Args_1;
  char (*pacVar13) [43];
  char (*Args_1_00) [43];
  char (*pacVar14) [53];
  byte bVar15;
  Uint32 UVar16;
  RenderTargetBlendDesc *pRVar17;
  char (*in_R8) [63];
  COLOR_MASK CVar18;
  bool bVar19;
  long lVar20;
  string _msg;
  GLenum err;
  GLenum err_4;
  GLint *in_stack_ffffffffffffff68;
  GLint *Args_4;
  char (*in_stack_ffffffffffffff78) [14];
  string local_80;
  uint local_5c;
  Uint32 local_58;
  int local_54;
  RenderTargetBlendDesc *local_50;
  BlendStateDesc *local_48;
  GLint *local_40;
  GLContextState *local_38;
  
  local_58 = RenderTargetMask;
  local_38 = this;
  if (SampleMask != 0xffffffff) {
    FormatString<char[55]>
              (&local_80,(char (*) [55])"Sample mask is not currently implemented in GL backend");
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char (*) [63])0x0;
      (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  bVar15 = BSDsc->RenderTargets[0].BlendEnable;
  if (0xff < local_58) {
    FormatString<char[21],unsigned_int,char[63]>
              (&local_80,(Diligent *)"Render target mask (",(char (*) [21])&local_58,
               (uint *)") contains bits that correspond to non-existent render targets",in_R8);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2db);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_58 = local_58 & 0xff;
  }
  Args_4 = &(local_38->m_Caps).MaxDrawBuffers;
  bVar2 = (byte)(local_38->m_Caps).MaxDrawBuffers;
  Args_1 = (BlendStateDesc *)CONCAT71((int7)((ulong)local_38 >> 8),bVar2);
  local_40 = Args_4;
  if (local_58 >> (bVar2 & 0x1f) != 0) {
    if (local_58 == 0) {
      local_5c = 0x20;
    }
    else {
      local_5c = 0;
      if (local_58 != 0) {
        for (; (local_58 >> local_5c & 1) == 0; local_5c = local_5c + 1) {
        }
      }
    }
    pcVar12 = ") contains buffer ";
    FormatString<char[21],unsigned_int,char[19],unsigned_int,char[32],int,char[14]>
              (&local_80,(Diligent *)"Render target mask (",(char (*) [21])&local_58,
               (uint *)") contains buffer ",(char (*) [19])&local_5c,
               (uint *)" but this device only supports ",(char (*) [32])Args_4,
               (int *)" draw buffers",in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff68 = Args_4;
    if (DebugMessageCallback != (undefined *)0x0) {
      pcVar12 = (char *)0x0;
      (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0,0);
      in_stack_ffffffffffffff68 = Args_4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    Args_1 = (BlendStateDesc *)CONCAT71((int7)((ulong)pcVar12 >> 8),(byte)*local_40);
    local_58 = ~(-1 << ((byte)*local_40 & 0x1f)) & local_58;
  }
  pRVar17 = BSDsc->RenderTargets;
  local_50 = pRVar17;
  if (local_58 != 0) {
    bVar19 = false;
    CVar18 = COLOR_MASK_NONE;
    UVar16 = local_58;
    local_48 = BSDsc;
    do {
      uVar10 = 0;
      if (UVar16 != 0) {
        for (; (UVar16 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if ((7 < uVar10) || (*local_40 <= (int)uVar10)) {
        FormatString<char[26],char[72]>
                  (&local_80,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                   &Args_1->AlphaToCoverageEnable);
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2e9);
        pRVar17 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pRVar17 = local_50;
        }
      }
      if (pRVar17[uVar10].RenderTargetWriteMask == COLOR_MASK_NONE) {
        FormatString<char[103]>
                  (&local_80,
                   (char (*) [103])
                   "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask"
                  );
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2ec);
        pRVar17 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pRVar17 = local_50;
        }
      }
      CVar3 = pRVar17[uVar10].RenderTargetWriteMask;
      CVar11 = CVar3;
      if (CVar18 != COLOR_MASK_NONE) {
        CVar11 = CVar18;
        bVar19 = (bool)(CVar18 != CVar3 | bVar19);
      }
      CVar18 = CVar11;
      if ((local_48->IndependentBlendEnable == true) && (pRVar17[uVar10].BlendEnable != false)) {
        bVar15 = 1;
      }
      UVar16 = UVar16 & ~(1 << (uVar10 & 0x1f));
      Args_1 = local_48;
    } while (UVar16 != 0);
    BSDsc = local_48;
    if (bVar19) {
      if (local_58 != 0) {
        UVar16 = local_58;
        do {
          uVar10 = 0;
          if (UVar16 != 0) {
            for (; (UVar16 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          if ((7 < uVar10) || (*local_40 <= (int)uVar10)) {
            FormatString<char[26],char[72]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])
                       "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                       &Args_1->AlphaToCoverageEnable);
            Args_1 = (BlendStateDesc *)0x300;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x300);
            pRVar17 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
              pRVar17 = local_50;
            }
          }
          UVar16 = UVar16 & ~(1 << (uVar10 & 0x1f));
          SetColorWriteMaskIndexed(local_38,uVar10,(uint)pRVar17[uVar10].RenderTargetWriteMask);
          pRVar17 = local_50;
          BSDsc = local_48;
        } while (UVar16 != 0);
      }
    }
    else if (CVar18 != COLOR_MASK_NONE) {
      SetColorWriteMask(local_38,(uint)CVar18);
      BSDsc = local_48;
    }
  }
  if ((bVar15 & 1) == 0) {
    glDisable();
    local_5c = glGetError();
    if (local_5c == 0) {
      return;
    }
    LogError<false,char[33],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354,(char (*) [33])"Failed to disable alpha blending",
               (char (*) [17])"\nGL Error Code: ",&local_5c);
    FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354);
    goto LAB_00343fe5;
  }
  glEnable();
  local_5c = glGetError();
  if (local_5c != 0) {
    in_stack_ffffffffffffff68 = (GLint *)&local_5c;
    LogError<false,char[32],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e,(char (*) [32])"Failed to enable alpha blending",
               (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
    FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
    Args_1 = (BlendStateDesc *)0x30e;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if (BSDsc->AlphaToCoverageEnable == true) {
    glEnable();
    local_5c = glGetError();
    if (local_5c != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&local_5c;
      LogError<false,char[35],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313,(char (*) [35])"Failed to enable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
      Args_1 = (BlendStateDesc *)0x313;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313);
LAB_00343725:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    glDisable();
    local_5c = glGetError();
    if (local_5c != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&local_5c;
      LogError<false,char[36],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318,(char (*) [36])"Failed to disable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
      Args_1 = (BlendStateDesc *)0x318;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318);
      goto LAB_00343725;
    }
  }
  if (BSDsc->IndependentBlendEnable == true) {
    local_5c = 0;
    paVar1 = &local_80.field_2;
    pRVar17 = local_50;
    do {
      pacVar13 = (char (*) [43])(long)(int)local_5c;
      if ((int)local_5c < *local_40) {
        if (pRVar17[(long)pacVar13].BlendEnable == false) {
          (*__glewDisablei)(0xbe2,local_5c);
          local_54 = glGetError();
          pRVar17 = local_50;
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[33],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b,(char (*) [33])"Failed to disable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b);
            goto LAB_00343c4a;
          }
        }
        else {
          Args_1_00 = pacVar13;
          (*__glewEnablei)(0xbe2,local_5c);
          local_54 = glGetError();
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[32],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b,(char (*) [32])"Failed to enable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
            Args_1_00 = (char (*) [43])0x32b;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pRVar17 = local_50;
          BVar4 = local_50[(long)pacVar13].SrcBlend;
          if (0x11 < (long)(char)BVar4) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1_00);
            Args_1_00 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          uVar6 = *(undefined4 *)
                   (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                   (long)(char)BVar4 * 4);
          BVar4 = pRVar17[(long)pacVar13].DestBlend;
          if (0x11 < (long)(char)BVar4) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1_00);
            Args_1_00 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          local_48 = (BlendStateDesc *)CONCAT44(local_48._4_4_,uVar6);
          GVar7 = *(GLenum *)
                   (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                   (long)(char)BVar4 * 4);
          BVar4 = pRVar17[(long)pacVar13].SrcBlendAlpha;
          if (0x11 < (long)(char)BVar4) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1_00);
            Args_1_00 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          uVar10 = *(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                            (long)(char)BVar4 * 4);
          BVar4 = pRVar17[(long)pacVar13].DestBlendAlpha;
          if (0x11 < (long)(char)BVar4) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1_00);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pacVar14 = (char (*) [53])(ulong)uVar10;
          (*__glewBlendFuncSeparatei)
                    (local_5c,(GLenum)local_48,GVar7,uVar10,
                     *(GLenum *)
                      (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                      (long)(char)BVar4 * 4));
          local_54 = glGetError();
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[40],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332,(char (*) [40])"Failed to set separate blending factors",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
            pacVar14 = (char (*) [53])0x332;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          BVar5 = pRVar17[(long)pacVar13].BlendOp;
          if (5 < (long)(char)BVar5) {
            FormatString<char[26],char[53]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",
                       pacVar14);
            pacVar14 = (char (*) [53])0x195;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x195);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          GVar7 = *(GLenum *)
                   (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::BlendOperation2GLBlendOpMap
                   + (long)(char)BVar5 * 4);
          BVar5 = pRVar17[(long)pacVar13].BlendOpAlpha;
          if (5 < (long)(char)BVar5) {
            FormatString<char[26],char[53]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",
                       pacVar14);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x195);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          (*__glewBlendEquationSeparatei)
                    (local_5c,GVar7,
                     *(GLenum *)
                      (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::
                       BlendOperation2GLBlendOpMap + (long)(char)BVar5 * 4));
          local_54 = glGetError();
          pRVar17 = local_50;
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[42],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336,(char (*) [42])"Failed to set separate blending equations",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336);
LAB_00343c4a:
            pRVar17 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != paVar1) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
              pRVar17 = local_50;
            }
          }
        }
      }
      else if (pRVar17[(long)pacVar13].BlendEnable != false) {
        FormatString<char[36],int,char[32],int,char[14]>
                  (&local_80,(Diligent *)"Blend is enabled for render target ",
                   (char (*) [36])&local_5c,(int *)" but this device only supports ",
                   (char (*) [32])local_40,(int *)" draw buffers",
                   (char (*) [14])in_stack_ffffffffffffff68);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0,0);
        }
        goto LAB_00343c4a;
      }
      bVar19 = 6 < (int)local_5c;
      local_5c = local_5c + 1;
      if (bVar19) {
        return;
      }
    } while( true );
  }
  lVar20 = (long)(char)BSDsc->RenderTargets[0].SrcBlend;
  if (0x11 < lVar20) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &Args_1->AlphaToCoverageEnable);
    Args_1 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar7 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar20 * 4);
  lVar20 = (long)(char)BSDsc->RenderTargets[0].DestBlend;
  if (0x11 < lVar20) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &Args_1->AlphaToCoverageEnable);
    Args_1 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar8 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar20 * 4);
  lVar20 = (long)(char)BSDsc->RenderTargets[0].SrcBlendAlpha;
  if (0x11 < lVar20) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &Args_1->AlphaToCoverageEnable);
    Args_1 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar9 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar20 * 4);
  lVar20 = (long)(char)BSDsc->RenderTargets[0].DestBlendAlpha;
  if (0x11 < lVar20) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &Args_1->AlphaToCoverageEnable);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  pacVar14 = (char (*) [53])
             (ulong)*(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                             lVar20 * 4);
  (*__glewBlendFuncSeparate)
            (GVar7,GVar8,GVar9,
             *(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                      lVar20 * 4));
  local_5c = glGetError();
  if (local_5c != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348,(char (*) [31])"Failed to set blending factors",
               (char (*) [17])"\nGL Error Code: ",&local_5c);
    FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
    pacVar14 = (char (*) [53])0x348;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  lVar20 = (long)(char)BSDsc->RenderTargets[0].BlendOp;
  if (5 < lVar20) {
    FormatString<char[26],char[53]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",pacVar14);
    pacVar14 = (char (*) [53])0x195;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x195);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar7 = *(GLenum *)
           (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::BlendOperation2GLBlendOpMap +
           lVar20 * 4);
  lVar20 = (long)(char)BSDsc->RenderTargets[0].BlendOpAlpha;
  if (5 < lVar20) {
    FormatString<char[26],char[53]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",pacVar14);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x195);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  (*__glewBlendEquationSeparate)
            (GVar7,*(GLenum *)
                    (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::
                     BlendOperation2GLBlendOpMap + lVar20 * 4));
  local_5c = glGetError();
  if (local_5c == 0) {
    return;
  }
  LogError<false,char[33],char[17],unsigned_int>
            (false,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d,(char (*) [33])"Failed to set blending equations",
             (char (*) [17])"\nGL Error Code: ",&local_5c);
  FormatString<char[6]>(&local_80,(char (*) [6])0x8506c9);
  DebugAssertionFailed
            (local_80._M_dataplus._M_p,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d);
LAB_00343fe5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GLContextState::SetBlendState(const BlendStateDesc& BSDsc, Uint32 RenderTargetMask, Uint32 SampleMask)
{
    if (SampleMask != 0xFFFFFFFF)
        LOG_ERROR_MESSAGE("Sample mask is not currently implemented in GL backend");

    bool       bEnableBlend               = BSDsc.RenderTargets[0].BlendEnable;
    bool       bUseIndexedColorWriteMasks = false;
    COLOR_MASK NonIndexedColorMask        = COLOR_MASK_NONE;

    if (RenderTargetMask & ~((1u << MAX_RENDER_TARGETS) - 1u))
    {
        UNEXPECTED("Render target mask (", RenderTargetMask, ") contains bits that correspond to non-existent render targets");
        RenderTargetMask &= (1u << MAX_RENDER_TARGETS) - 1u;
    }

    if (RenderTargetMask & ~((1u << m_Caps.MaxDrawBuffers) - 1u))
    {
        LOG_ERROR_MESSAGE("Render target mask (", RenderTargetMask, ") contains buffer ", PlatformMisc::GetLSB(RenderTargetMask), " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
        RenderTargetMask &= (1u << m_Caps.MaxDrawBuffers) - 1u;
    }

    for (Uint32 Mask = RenderTargetMask; Mask != 0;)
    {
        Uint32 rt = PlatformMisc::GetLSB(Mask);
        Mask &= ~(1u << rt);
        VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);

        const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[rt];
        VERIFY(RT.RenderTargetWriteMask != COLOR_MASK_NONE, "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask");
        if (NonIndexedColorMask == COLOR_MASK_NONE)
        {
            NonIndexedColorMask = RT.RenderTargetWriteMask;
        }
        else if (NonIndexedColorMask != RT.RenderTargetWriteMask)
        {
            bUseIndexedColorWriteMasks = true;
        }

        if (BSDsc.IndependentBlendEnable && RT.BlendEnable)
            bEnableBlend = true;
    }

    if (bUseIndexedColorWriteMasks)
    {
        for (Uint32 Mask = RenderTargetMask; Mask != 0;)
        {
            Uint32 rt = PlatformMisc::GetLSB(Mask);
            Mask &= ~(1u << rt);
            VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);
            SetColorWriteMaskIndexed(rt, BSDsc.RenderTargets[rt].RenderTargetWriteMask);
        }
    }
    else if (NonIndexedColorMask != COLOR_MASK_NONE)
    {
        // If the color write mask is COLOR_MASK_NONE, the draw buffer is disabled with glDrawBuffer.
        SetColorWriteMask(NonIndexedColorMask);
    }

    if (bEnableBlend)
    {
        //  Sets the blend enable flag for ALL color buffers.
        glEnable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

        if (BSDsc.AlphaToCoverageEnable)
        {
            glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to enable alpha to coverage");
        }
        else
        {
            glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to disable alpha to coverage");
        }

        if (BSDsc.IndependentBlendEnable)
        {
            for (int i = 0; i < static_cast<int>(MAX_RENDER_TARGETS); ++i)
            {
                const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[i];

                if (i >= m_Caps.MaxDrawBuffers)
                {
                    if (RT.BlendEnable)
                        LOG_ERROR_MESSAGE("Blend is enabled for render target ", i, " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
                    continue;
                }

                if (RT.BlendEnable)
                {
                    glEnablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

                    GLenum srcFactorRGB   = BlendFactor2GLBlend(RT.SrcBlend);
                    GLenum dstFactorRGB   = BlendFactor2GLBlend(RT.DestBlend);
                    GLenum srcFactorAlpha = BlendFactor2GLBlend(RT.SrcBlendAlpha);
                    GLenum dstFactorAlpha = BlendFactor2GLBlend(RT.DestBlendAlpha);
                    glBlendFuncSeparatei(i, srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending factors");
                    GLenum modeRGB   = BlendOperation2GLBlendOp(RT.BlendOp);
                    GLenum modeAlpha = BlendOperation2GLBlendOp(RT.BlendOpAlpha);
                    glBlendEquationSeparatei(i, modeRGB, modeAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending equations");
                }
                else
                {
                    glDisablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
                }
            }
        }
        else
        {
            const RenderTargetBlendDesc& RT0 = BSDsc.RenderTargets[0];

            GLenum srcFactorRGB   = BlendFactor2GLBlend(RT0.SrcBlend);
            GLenum dstFactorRGB   = BlendFactor2GLBlend(RT0.DestBlend);
            GLenum srcFactorAlpha = BlendFactor2GLBlend(RT0.SrcBlendAlpha);
            GLenum dstFactorAlpha = BlendFactor2GLBlend(RT0.DestBlendAlpha);
            glBlendFuncSeparate(srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending factors");

            GLenum modeRGB   = BlendOperation2GLBlendOp(RT0.BlendOp);
            GLenum modeAlpha = BlendOperation2GLBlendOp(RT0.BlendOpAlpha);
            glBlendEquationSeparate(modeRGB, modeAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending equations");
        }
    }
    else
    {
        //  Sets the blend disable flag for ALL color buffers.
        glDisable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
    }
}